

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O0

void add_door(level *lev,int x,int y,mkroom *aroom)

{
  int local_2c;
  mkroom *pmStack_28;
  int tmp;
  mkroom *broom;
  mkroom *aroom_local;
  int y_local;
  int x_local;
  level *lev_local;
  
  aroom->doorct = aroom->doorct + '\x01';
  pmStack_28 = aroom + 1;
  if (aroom[1].hx < '\0') {
    local_2c = lev->doorindex;
  }
  else {
    for (local_2c = lev->doorindex; aroom[1].fdoor < local_2c; local_2c = local_2c + -1) {
      lev->doors[local_2c] = lev->doors[local_2c + -1];
    }
  }
  lev->doorindex = lev->doorindex + 1;
  lev->doors[local_2c].x = (xchar)x;
  lev->doors[local_2c].y = (xchar)y;
  for (; -1 < pmStack_28->hx; pmStack_28 = pmStack_28 + 1) {
    pmStack_28->fdoor = pmStack_28->fdoor + '\x01';
  }
  return;
}

Assistant:

void add_door(struct level *lev, int x, int y, struct mkroom *aroom)
{
	struct mkroom *broom;
	int tmp;

	aroom->doorct++;
	broom = aroom+1;
	if (broom->hx < 0)
		tmp = lev->doorindex;
	else
		for (tmp = lev->doorindex; tmp > broom->fdoor; tmp--)
			lev->doors[tmp] = lev->doors[tmp-1];
	lev->doorindex++;
	lev->doors[tmp].x = x;
	lev->doors[tmp].y = y;
	for ( ; broom->hx >= 0; broom++) broom->fdoor++;
}